

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void rpc_tests::CheckRpc(vector<RPCArg,_std::allocator<RPCArg>_> *params,UniValue *args,
                        RPCMethodImpl *test_impl)

{
  long lVar1;
  string m_key_name;
  string name;
  RPCResult result;
  RPCExamples examples;
  long in_FS_OFFSET;
  _Alloc_hider in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb20 [24];
  string in_stack_fffffffffffffb38;
  _Vector_impl_data in_stack_fffffffffffffb58;
  _Vector_impl_data in_stack_fffffffffffffb70;
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffffba0;
  RPCMethodImpl in_stack_fffffffffffffba8;
  JSONRPCRequest req;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  RPCResult local_268;
  string local_1e0 [32];
  string local_1c0 [32];
  RPCHelpMan rpc;
  string local_e8 [32];
  string local_c8 [32];
  RPCResult null_result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"",(allocator<char> *)&req);
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"None",(allocator<char> *)&rpc);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffb20._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb20._8_16_;
  m_key_name._M_dataplus._M_p = in_stack_fffffffffffffb18._M_p;
  RPCResult::RPCResult
            (&null_result,NONE,m_key_name,in_stack_fffffffffffffb38,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffffb58,
             SUB81(local_c8,0));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb88);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"dummy",(allocator<char> *)&req);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"dummy description",(allocator<char> *)&stack0xfffffffffffffb87);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb68,params);
  RPCResult::RPCResult(&local_268,&null_result);
  result.m_key_name._0_24_ = in_stack_fffffffffffffb20;
  result._0_8_ = in_stack_fffffffffffffb18._M_p;
  result._32_32_ = in_stack_fffffffffffffb38;
  result._64_24_ = in_stack_fffffffffffffb58;
  result._88_24_ = in_stack_fffffffffffffb70;
  result.m_cond._M_string_length = (size_type)pRVar2;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar3;
  result.m_cond.field_2._8_8_ = pRVar4;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffb50,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"",(allocator<char> *)&stack0xfffffffffffffb4f);
  local_288 = local_278;
  if (local_2a8 == local_298) {
    uStack_270 = uStack_290;
  }
  else {
    local_288 = local_2a8;
  }
  local_280 = local_2a0;
  local_2a0 = 0;
  local_298[0] = 0;
  local_2a8 = local_298;
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             &stack0xfffffffffffffb28,test_impl);
  name._M_string_length = in_stack_fffffffffffffb20._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_fffffffffffffb20._8_16_;
  name._M_dataplus._M_p = &stack0xfffffffffffffb28;
  examples.m_examples._M_string_length = (size_type)pRVar3;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar2;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar4;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffba0;
  RPCHelpMan::RPCHelpMan
            (&rpc,name,in_stack_fffffffffffffb38,
             (vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffffb58,
             (RPCResults)in_stack_fffffffffffffb70,examples,in_stack_fffffffffffffba8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffb28);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb50);
  RPCResult::~RPCResult(&local_268);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb68);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  JSONRPCRequest::JSONRPCRequest(&req);
  UniValue::operator=(&req.params,args);
  RPCHelpMan::HandleRequest((UniValue *)&stack0xfffffffffffffba8,&rpc,&req);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffba8);
  JSONRPCRequest::~JSONRPCRequest(&req);
  RPCHelpMan::~RPCHelpMan(&rpc);
  RPCResult::~RPCResult(&null_result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckRpc(const std::vector<RPCArg>& params, const UniValue& args, RPCHelpMan::RPCMethodImpl test_impl)
{
    auto null_result{RPCResult{RPCResult::Type::NONE, "", "None"}};
    const RPCHelpMan rpc{"dummy", "dummy description", params, null_result, RPCExamples{""}, test_impl};
    JSONRPCRequest req;
    req.params = args;

    rpc.HandleRequest(req);
}